

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_reset_dirty_x86_64(CPUState *cpu,ram_addr_t start1,ram_addr_t length)

{
  uc_struct_conflict7 *uc_00;
  CPUArchState *env_00;
  CPUTLB *pCVar1;
  size_t sVar2;
  uint local_38;
  uint n;
  uint i;
  int mmu_idx;
  CPUArchState *env;
  uc_struct_conflict *uc;
  ram_addr_t length_local;
  ram_addr_t start1_local;
  CPUState *cpu_local;
  
  uc_00 = cpu->uc;
  env_00 = (CPUArchState *)cpu->env_ptr;
  for (n = 0; (int)n < 3; n = n + 1) {
    pCVar1 = env_tlb(env_00);
    sVar2 = tlb_n_entries(pCVar1->f + (int)n);
    for (local_38 = 0; local_38 < (uint)sVar2; local_38 = local_38 + 1) {
      pCVar1 = env_tlb(env_00);
      tlb_reset_dirty_range_locked
                ((uc_struct_conflict *)uc_00,pCVar1->f[(int)n].table + local_38,start1,length);
    }
    for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
      pCVar1 = env_tlb(env_00);
      tlb_reset_dirty_range_locked
                ((uc_struct_conflict *)uc_00,pCVar1->d[(int)n].vtable + local_38,start1,length);
    }
  }
  return;
}

Assistant:

void tlb_reset_dirty(CPUState *cpu, ram_addr_t start1, ram_addr_t length)
{
    struct uc_struct *uc = cpu->uc;
    CPUArchState *env;

    int mmu_idx;

    env = cpu->env_ptr;
    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        unsigned int i;
        unsigned int n = tlb_n_entries(&env_tlb(env)->f[mmu_idx]);

        for (i = 0; i < n; i++) {
            tlb_reset_dirty_range_locked(uc, &env_tlb(env)->f[mmu_idx].table[i],
                                         start1, length);
        }

        for (i = 0; i < CPU_VTLB_SIZE; i++) {
            tlb_reset_dirty_range_locked(uc, &env_tlb(env)->d[mmu_idx].vtable[i],
                                         start1, length);
        }
    }
}